

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_tell(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_bigint)

{
  FILE *__stream;
  JSContext *ctx_00;
  JSContext *in_RDI;
  int64_t in_R8;
  int in_R9D;
  JSValue JVar1;
  JSValue JVar2;
  int64_t pos;
  FILE *f;
  JSValue v;
  int64_t in_stack_ffffffffffffff48;
  JSContext *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 uStack_c;
  
  JVar1.u._4_4_ = in_R9D;
  JVar1.u.int32 = in_stack_ffffffffffffff60;
  JVar1.tag = in_R8;
  __stream = (FILE *)js_std_file_get(in_stack_ffffffffffffff58,JVar1);
  if (__stream == (FILE *)0x0) {
    local_70._0_8_ = local_70._4_8_ << 0x20;
    local_70._8_8_ = 6;
  }
  else {
    ctx_00 = (JSContext *)ftello(__stream);
    if (in_R9D == 0) {
      if (ctx_00 == (JSContext *)(long)(int)ctx_00) {
        local_30._4_4_ = uStack_c;
        local_30._0_4_ = (int)ctx_00;
        local_28 = 0;
      }
      else {
        JVar1 = __JS_NewFloat64(in_RDI,(double)(long)ctx_00);
        local_60 = JVar1.u;
        local_30 = local_60;
        local_58 = JVar1.tag;
        local_28 = local_58;
      }
      local_70._8_8_ = local_28;
      local_70._0_8_ = local_30;
    }
    else {
      local_70 = (undefined1  [16])JS_NewBigInt64(ctx_00,in_stack_ffffffffffffff48);
    }
  }
  JVar2.u = (JSValueUnion)local_70._0_8_;
  JVar2.tag = local_70._8_8_;
  return JVar2;
}

Assistant:

static JSValue js_std_file_tell(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int is_bigint)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int64_t pos;
    if (!f)
        return JS_EXCEPTION;
#if defined(__linux__)
    pos = ftello(f);
#else
    pos = ftell(f);
#endif
    if (is_bigint)
        return JS_NewBigInt64(ctx, pos);
    else
        return JS_NewInt64(ctx, pos);
}